

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

int lddmc_member_cube_copy(MDD a,uint32_t *values,int *copy,size_t count)

{
  size_t local_30;
  size_t count_local;
  int *copy_local;
  uint32_t *values_local;
  MDD a_local;
  
  local_30 = count;
  copy_local = (int *)values;
  values_local = (uint32_t *)a;
  while( true ) {
    if (values_local == (uint32_t *)0x0) {
      return 0;
    }
    if (values_local == (uint32_t *)0x1) break;
    if (local_30 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x749,"int lddmc_member_cube_copy(MDD, uint32_t *, int *, size_t)");
    }
    if (*copy == 0) {
      values_local = (uint32_t *)lddmc_follow((MDD)values_local,*copy_local);
    }
    else {
      values_local = (uint32_t *)lddmc_followcopy((MDD)values_local);
    }
    copy_local = copy_local + 1;
    local_30 = local_30 - 1;
  }
  return 1;
}

Assistant:

int
lddmc_member_cube_copy(MDD a, uint32_t* values, int* copy, size_t count)
{
    while (1) {
        if (a == lddmc_false) return 0;
        if (a == lddmc_true) return 1;
        if (count <= 0) assert(count > 0); // size mismatch

        if (*copy) a = lddmc_followcopy(a);
        else a = lddmc_follow(a, *values);
        values++;
        count--;
    }
}